

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

OPJ_BOOL opj_t2_read_packet_data
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_pi_iterator_t *p_pi,
                   OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_length,
                   opj_packet_info_t *pack_info,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  opj_tcd_resolution_t *poVar4;
  long lVar5;
  void *pvVar6;
  OPJ_BYTE *new_cblk_data;
  opj_tcd_seg_t *l_seg;
  opj_tcd_precinct_t *l_prc;
  opj_tcd_resolution_t *l_res;
  opj_tcd_cblk_dec_t *l_cblk;
  opj_tcd_band_t *l_band;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_nb_code_blocks;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 p_max_length_local;
  OPJ_UINT32 *p_data_read_local;
  OPJ_BYTE *p_src_data_local;
  opj_pi_iterator_t *p_pi_local;
  opj_tcd_tile_t *p_tile_local;
  opj_t2_t *p_t2_local;
  
  poVar4 = p_tile->comps[p_pi->compno].resolutions;
  uVar1 = p_pi->resno;
  l_cblk = (opj_tcd_cblk_dec_t *)poVar4[uVar1].bands;
  l_nb_code_blocks = 0;
  l_band = (opj_tcd_band_t *)p_src_data;
  do {
    if (poVar4[uVar1].numbands <= l_nb_code_blocks) {
      *p_data_read = (int)l_band - (int)p_src_data;
      return 1;
    }
    lVar5 = *(long *)&l_cblk->x1 + (ulong)p_pi->precno * 0x38;
    if ((*(int *)&l_cblk->segs != *(int *)&l_cblk->data) &&
       (*(int *)((long)&l_cblk->segs + 4) != *(int *)((long)&l_cblk->data + 4))) {
      iVar2 = *(int *)(lVar5 + 0x10);
      iVar3 = *(int *)(lVar5 + 0x14);
      l_res = *(opj_tcd_resolution_t **)(lVar5 + 0x18);
      for (l_current_data._4_4_ = 0; l_current_data._4_4_ < (uint)(iVar2 * iVar3);
          l_current_data._4_4_ = l_current_data._4_4_ + 1) {
        if (l_res->bands[0].bandno != 0) {
          if (*(int *)&l_res->bands[0].field_0x14 == 0) {
            new_cblk_data = *(OPJ_BYTE **)&l_res->x1;
            *(int *)&l_res->bands[0].field_0x14 = *(int *)&l_res->bands[0].field_0x14 + 1;
            l_res->bands[0].y1 = 0;
          }
          else {
            new_cblk_data =
                 (OPJ_BYTE *)
                 (*(long *)&l_res->x1 + (ulong)(*(int *)&l_res->bands[0].field_0x14 - 1) * 0x28);
            if (*(int *)(new_cblk_data + 0xc) == *(int *)(new_cblk_data + 0x18)) {
              new_cblk_data = new_cblk_data + 0x28;
              *(int *)&l_res->bands[0].field_0x14 = *(int *)&l_res->bands[0].field_0x14 + 1;
            }
          }
          do {
            if (((opj_tcd_band_t *)((long)&l_band->x0 + (ulong)*(uint *)(new_cblk_data + 0x20)) <
                 l_band) ||
               (p_src_data + p_max_length <
                (OPJ_BYTE *)((long)&l_band->x0 + (ulong)*(uint *)(new_cblk_data + 0x20)))) {
              opj_event_msg(p_manager,2,
                            "read: segment too long (%d) with max (%d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n"
                            ,(ulong)*(uint *)(new_cblk_data + 0x20),(ulong)p_max_length,
                            (ulong)l_current_data._4_4_,p_pi->precno,l_nb_code_blocks,p_pi->resno,
                            p_pi->compno);
              return 1;
            }
            if ((uint)(l_res->bands[0].y1 + *(int *)(new_cblk_data + 0x20)) <
                (uint)l_res->bands[0].y1) {
              opj_event_msg(p_manager,1,
                            "read: segment too long (%d) with current size (%d > %d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n"
                            ,(ulong)*(uint *)(new_cblk_data + 0x20),(ulong)(uint)l_res->bands[0].y1,
                            (ulong)(-*(int *)(new_cblk_data + 0x20) - 1),l_current_data._4_4_,
                            p_pi->precno,l_nb_code_blocks,p_pi->resno,p_pi->compno);
              return 0;
            }
            if ((uint)l_res->bands[0].x1 <
                (uint)(l_res->bands[0].y1 + *(int *)(new_cblk_data + 0x20))) {
              pvVar6 = opj_realloc(*(void **)l_res,
                                   (ulong)(uint)(l_res->bands[0].y1 + *(int *)(new_cblk_data + 0x20)
                                                ));
              if (pvVar6 == (void *)0x0) {
                opj_free(*(void **)l_res);
                l_res->x0 = 0;
                l_res->y0 = 0;
                l_res->bands[0].x1 = 0;
                return 0;
              }
              l_res->bands[0].x1 = l_res->bands[0].y1 + *(int *)(new_cblk_data + 0x20);
              *(void **)l_res = pvVar6;
            }
            memcpy((void *)(*(long *)l_res + (ulong)(uint)l_res->bands[0].y1),l_band,
                   (ulong)*(uint *)(new_cblk_data + 0x20));
            if (*(int *)(new_cblk_data + 0xc) == 0) {
              *(opj_tcd_resolution_t **)new_cblk_data = l_res;
              *(OPJ_INT32 *)(new_cblk_data + 8) = l_res->bands[0].y1;
            }
            l_band = (opj_tcd_band_t *)((long)&l_band->x0 + (ulong)*(uint *)(new_cblk_data + 0x20));
            *(int *)(new_cblk_data + 0xc) =
                 *(int *)(new_cblk_data + 0x1c) + *(int *)(new_cblk_data + 0xc);
            l_res->bands[0].bandno = l_res->bands[0].bandno - *(int *)(new_cblk_data + 0x1c);
            *(undefined4 *)(new_cblk_data + 0x10) = *(undefined4 *)(new_cblk_data + 0xc);
            l_res->bands[0].y1 = *(int *)(new_cblk_data + 0x20) + l_res->bands[0].y1;
            *(int *)(new_cblk_data + 0x14) =
                 *(int *)(new_cblk_data + 0x20) + *(int *)(new_cblk_data + 0x14);
            if (l_res->bands[0].bandno != 0) {
              new_cblk_data = new_cblk_data + 0x28;
              *(int *)&l_res->bands[0].field_0x14 = *(int *)&l_res->bands[0].field_0x14 + 1;
            }
          } while (l_res->bands[0].bandno != 0);
          *(undefined4 *)&l_res->bands[0].precincts = *(undefined4 *)&l_res->bands[0].field_0x14;
        }
        l_res = (opj_tcd_resolution_t *)&l_res->bands[0].precincts_data_size;
      }
    }
    l_cblk = (opj_tcd_cblk_dec_t *)&l_cblk->numnewpasses;
    l_nb_code_blocks = l_nb_code_blocks + 1;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_data(   opj_t2_t* p_t2,
                                    opj_tcd_tile_t *p_tile,
                                    opj_pi_iterator_t *p_pi,
                                    OPJ_BYTE *p_src_data,
                                    OPJ_UINT32 * p_data_read,
                                    OPJ_UINT32 p_max_length,
                                    opj_packet_info_t *pack_info,
                                    opj_event_mgr_t* p_manager)
{
        OPJ_UINT32 bandno, cblkno;
        OPJ_UINT32 l_nb_code_blocks;
        OPJ_BYTE *l_current_data = p_src_data;
        opj_tcd_band_t *l_band = 00;
        opj_tcd_cblk_dec_t* l_cblk = 00;
        opj_tcd_resolution_t* l_res = &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

        OPJ_ARG_NOT_USED(p_t2);
        OPJ_ARG_NOT_USED(pack_info);

        l_band = l_res->bands;
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];

                if ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) {
                        ++l_band;
                        continue;
                }

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                l_cblk = l_prc->cblks.dec;

                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                        opj_tcd_seg_t *l_seg = 00;

                        if (!l_cblk->numnewpasses) {
                                /* nothing to do */
                                ++l_cblk;
                                continue;
                        }

                        if (!l_cblk->numsegs) {
                                l_seg = l_cblk->segs;
                                ++l_cblk->numsegs;
                                l_cblk->data_current_size = 0;
                        }
                        else {
                                l_seg = &l_cblk->segs[l_cblk->numsegs - 1];

                                if (l_seg->numpasses == l_seg->maxpasses) {
                                        ++l_seg;
                                        ++l_cblk->numsegs;
                                }
                        }

                        do {
                                /* Check possible overflow (on l_current_data only, assumes input args already checked) then size */
                                if ((((OPJ_SIZE_T)l_current_data + (OPJ_SIZE_T)l_seg->newlen) < (OPJ_SIZE_T)l_current_data) || (l_current_data + l_seg->newlen > p_src_data + p_max_length)) {
                                        opj_event_msg(p_manager, EVT_WARNING, "read: segment too long (%d) with max (%d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n",
																								l_seg->newlen, p_max_length, cblkno, p_pi->precno, bandno, p_pi->resno, p_pi->compno);
                                        return OPJ_TRUE;
                                }

#ifdef USE_JPWL
                        /* we need here a j2k handle to verify if making a check to
                        the validity of cblocks parameters is selected from user (-W) */

                                /* let's check that we are not exceeding */
                                if ((l_cblk->len + l_seg->newlen) > 8192) {
                                        opj_event_msg(p_manager, EVT_WARNING,
                                                "JPWL: segment too long (%d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n",
                                                l_seg->newlen, cblkno, p_pi->precno, bandno, p_pi->resno, p_pi->compno);
                                        if (!JPWL_ASSUME) {
                                                opj_event_msg(p_manager, EVT_ERROR, "JPWL: giving up\n");
                                                return OPJ_FALSE;
                                        }
                                        l_seg->newlen = 8192 - l_cblk->len;
                                        opj_event_msg(p_manager, EVT_WARNING, "      - truncating segment to %d\n", l_seg->newlen);
                                        break;
                                };

#endif /* USE_JPWL */
                                /* Check possible overflow on size */
                                if ((l_cblk->data_current_size + l_seg->newlen) < l_cblk->data_current_size) {
                                        opj_event_msg(p_manager, EVT_ERROR, "read: segment too long (%d) with current size (%d > %d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n",
                                                l_seg->newlen, l_cblk->data_current_size, 0xFFFFFFFF - l_seg->newlen, cblkno, p_pi->precno, bandno, p_pi->resno, p_pi->compno);
                                        return OPJ_FALSE;
                                }
                                /* Check if the cblk->data have allocated enough memory */
                                if ((l_cblk->data_current_size + l_seg->newlen) > l_cblk->data_max_size) {
                                    OPJ_BYTE* new_cblk_data = (OPJ_BYTE*) opj_realloc(l_cblk->data, l_cblk->data_current_size + l_seg->newlen);
                                    if(! new_cblk_data) {
                                        opj_free(l_cblk->data);
                                        l_cblk->data = NULL;
                                        l_cblk->data_max_size = 0;
                                        /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to realloc code block cata!\n"); */
                                        return OPJ_FALSE;
                                    }
                                    l_cblk->data_max_size = l_cblk->data_current_size + l_seg->newlen;
                                    l_cblk->data = new_cblk_data;
                                }
                               
                                memcpy(l_cblk->data + l_cblk->data_current_size, l_current_data, l_seg->newlen);

                                if (l_seg->numpasses == 0) {
                                        l_seg->data = &l_cblk->data;
                                        l_seg->dataindex = l_cblk->data_current_size;
                                }

                                l_current_data += l_seg->newlen;
                                l_seg->numpasses += l_seg->numnewpasses;
                                l_cblk->numnewpasses -= l_seg->numnewpasses;

                                l_seg->real_num_passes = l_seg->numpasses;
                                l_cblk->data_current_size += l_seg->newlen;
                                l_seg->len += l_seg->newlen;

                                if (l_cblk->numnewpasses > 0) {
                                        ++l_seg;
                                        ++l_cblk->numsegs;
                                }
                        } while (l_cblk->numnewpasses > 0);

                        l_cblk->real_num_segs = l_cblk->numsegs;
                        ++l_cblk;
                } /* next code_block */

                ++l_band;
        }

        *(p_data_read) = (OPJ_UINT32)(l_current_data - p_src_data);


        return OPJ_TRUE;
}